

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

uchar MX_EQ(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  if (b_cols != a_cols || b_rows != a_rows) {
    return '\0';
  }
  bVar7 = a_rows == 0;
  if (!bVar7) {
    uVar4 = 0;
    do {
      if (a_cols != 0) {
        bVar6 = a_cols != 0;
        if (*a[uVar4] == *b[uVar4]) {
          lVar5 = 0;
          do {
            if (a_cols - 1 == (int)lVar5) goto LAB_00101e38;
            lVar2 = lVar5 + 1;
            lVar1 = lVar5 + 1;
            lVar3 = lVar5 + 1;
            lVar5 = lVar1;
          } while (a[uVar4][lVar2] == b[uVar4][lVar3]);
          bVar6 = (uint)lVar1 < a_cols;
        }
        if (bVar6) {
          return bVar7;
        }
      }
LAB_00101e38:
      uVar4 = uVar4 + 1;
      bVar7 = a_rows <= uVar4;
    } while (uVar4 != a_rows);
  }
  return bVar7;
}

Assistant:

uint8_t MX_EQ(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
          uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_rows != b_rows)
        return 0;
    if (a_cols != b_cols)
        return 0;

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            if (a[i][j] != b[i][j])
                return 0;
    return 1;
}